

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  int iVar21;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  long lVar25;
  byte bVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  float *vertices_2;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  Scene *scene;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined4 uVar72;
  uint uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  uint uVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  uint uVar85;
  uint uVar86;
  undefined1 auVar84 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined8 local_2698;
  undefined8 uStack_2690;
  Geometry *local_2680;
  ulong local_2678;
  ulong local_2670;
  ulong local_2668;
  ulong local_2660;
  ulong local_2658;
  ulong local_2650;
  StackItemT<embree::NodeRefPtr<8>_> *local_2648;
  Scene *local_2640;
  long local_2638;
  long local_2630;
  RTCFilterFunctionNArguments args;
  undefined8 local_25f8;
  undefined8 uStack_25f0;
  undefined1 local_25e8 [16];
  undefined1 local_25d8 [16];
  undefined1 local_25c8 [16];
  undefined1 local_25b8 [16];
  byte local_25a7;
  float local_2598 [4];
  float local_2588 [4];
  undefined1 local_2578 [16];
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [32];
  undefined8 local_24f8;
  undefined8 uStack_24f0;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_2648 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar93 = ZEXT3264(auVar62);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar94 = ZEXT3264(auVar63);
  auVar64 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar95 = ZEXT3264(auVar64);
  auVar43 = vmulss_avx512f(auVar62._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar72 = auVar43._0_4_;
  auVar78._4_4_ = uVar72;
  auVar78._0_4_ = uVar72;
  auVar78._8_4_ = uVar72;
  auVar78._12_4_ = uVar72;
  auVar78._16_4_ = uVar72;
  auVar78._20_4_ = uVar72;
  auVar78._24_4_ = uVar72;
  auVar78._28_4_ = uVar72;
  auVar43 = vmulss_avx512f(auVar63._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar44 = vmulss_avx512f(auVar64._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar73 = auVar43._0_4_;
  uVar79 = auVar44._0_4_;
  local_2658 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2660 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2668 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2670 = local_2658 ^ 0x20;
  local_2678 = local_2660 ^ 0x20;
  uVar38 = local_2668 ^ 0x20;
  auVar62 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar96 = ZEXT3264(auVar62);
  iVar23 = (tray->tfar).field_0.i[k];
  auVar77 = ZEXT3264(CONCAT428(iVar23,CONCAT424(iVar23,CONCAT420(iVar23,CONCAT416(iVar23,CONCAT412(
                                                  iVar23,CONCAT48(iVar23,CONCAT44(iVar23,iVar23)))))
                                               )));
  auVar62._8_4_ = 0x80000000;
  auVar62._0_8_ = 0x8000000080000000;
  auVar62._12_4_ = 0x80000000;
  auVar62._16_4_ = 0x80000000;
  auVar62._20_4_ = 0x80000000;
  auVar62._24_4_ = 0x80000000;
  auVar62._28_4_ = 0x80000000;
  auVar62 = vxorps_avx512vl(auVar78,auVar62);
  auVar97 = ZEXT3264(auVar62);
  auVar63._0_8_ = CONCAT44(uVar73,uVar73) ^ 0x8000000080000000;
  auVar63._8_4_ = uVar73 ^ 0x80000000;
  auVar63._12_4_ = uVar73 ^ 0x80000000;
  auVar63._16_4_ = uVar73 ^ 0x80000000;
  auVar63._20_4_ = uVar73 ^ 0x80000000;
  auVar63._24_4_ = uVar73 ^ 0x80000000;
  auVar63._28_4_ = uVar73 ^ 0x80000000;
  auVar84 = ZEXT3264(auVar63);
  auVar64._0_8_ = CONCAT44(uVar79,uVar79) ^ 0x8000000080000000;
  auVar64._8_4_ = uVar79 ^ 0x80000000;
  auVar64._12_4_ = uVar79 ^ 0x80000000;
  auVar64._16_4_ = uVar79 ^ 0x80000000;
  auVar64._20_4_ = uVar79 ^ 0x80000000;
  auVar64._24_4_ = uVar79 ^ 0x80000000;
  auVar64._28_4_ = uVar79 ^ 0x80000000;
  auVar87 = ZEXT3264(auVar64);
  local_2528 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar62 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar89 = ZEXT3264(auVar62);
  auVar91 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  uVar36 = local_2670;
  uVar41 = local_2658;
  uVar27 = local_2660;
  uVar42 = local_2668;
  uVar30 = local_2678;
  do {
    do {
      do {
        if (local_2648 == stack) {
          return;
        }
        pSVar22 = local_2648 + -1;
        local_2648 = local_2648 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar22->dist);
      sVar35 = (local_2648->ptr).ptr;
      do {
        auVar78 = auVar87._0_32_;
        auVar62 = auVar84._0_32_;
        if ((sVar35 & 8) == 0) {
          uVar24 = sVar35 & 0xfffffffffffffff0;
          uVar72 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar69._4_4_ = uVar72;
          auVar69._0_4_ = uVar72;
          auVar69._8_4_ = uVar72;
          auVar69._12_4_ = uVar72;
          auVar69._16_4_ = uVar72;
          auVar69._20_4_ = uVar72;
          auVar69._24_4_ = uVar72;
          auVar69._28_4_ = uVar72;
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar41),auVar69,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar41));
          auVar65 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar93._0_32_,auVar97._0_32_);
          auVar66 = vmaxps_avx512vl(auVar96._0_32_,auVar65);
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar27),auVar69,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar27));
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar42),auVar69,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar42));
          auVar65 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar94._0_32_,auVar62);
          auVar67 = vfmadd213ps_avx512vl(ZEXT1632(auVar44),auVar95._0_32_,auVar78);
          auVar65 = vmaxps_avx(auVar65,auVar67);
          auVar65 = vmaxps_avx(auVar66,auVar65);
          in_ZMM13 = ZEXT3264(auVar65);
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar36),auVar69,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar36));
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar30),auVar69,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar30));
          auVar67 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar93._0_32_,auVar97._0_32_);
          auVar66 = vfmadd213ps_avx512vl(ZEXT1632(auVar44),auVar94._0_32_,auVar62);
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar24 + 0x100 + uVar38),auVar69,
                                    *(undefined1 (*) [32])(uVar24 + 0x40 + uVar38));
          auVar68 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar95._0_32_,auVar78);
          auVar66 = vminps_avx(auVar66,auVar68);
          auVar67 = vminps_avx(auVar77._0_32_,auVar67);
          auVar66 = vminps_avx(auVar67,auVar66);
          if (((uint)sVar35 & 7) == 6) {
            uVar19 = vcmpps_avx512vl(auVar65,auVar66,2);
            uVar16 = vcmpps_avx512vl(auVar69,*(undefined1 (*) [32])(uVar24 + 0x1c0),0xd);
            uVar17 = vcmpps_avx512vl(auVar69,*(undefined1 (*) [32])(uVar24 + 0x1e0),1);
            bVar26 = (byte)uVar19 & (byte)uVar16 & (byte)uVar17;
          }
          else {
            uVar19 = vcmpps_avx512vl(auVar65,auVar66,2);
            bVar26 = (byte)uVar19;
          }
          unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),(uint)bVar26);
        }
        if ((sVar35 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar23 = 4;
          }
          else {
            auVar65 = *(undefined1 (*) [32])(sVar35 & 0xfffffffffffffff0);
            auVar66 = ((undefined1 (*) [32])(sVar35 & 0xfffffffffffffff0))[1];
            auVar88 = auVar89._0_32_;
            auVar90 = auVar91._0_32_;
            auVar92 = in_ZMM13._0_32_;
            auVar67 = vpternlogd_avx512vl(auVar88,auVar92,auVar90,0xf8);
            uVar24 = unaff_RBP & 0xffffffff;
            auVar69 = vpcompressd_avx512vl(auVar67);
            bVar12 = (bool)((byte)uVar24 & 1);
            auVar68._0_4_ = (uint)bVar12 * auVar69._0_4_ | (uint)!bVar12 * auVar67._0_4_;
            bVar12 = (bool)((byte)(uVar24 >> 1) & 1);
            auVar68._4_4_ = (uint)bVar12 * auVar69._4_4_ | (uint)!bVar12 * auVar67._4_4_;
            bVar12 = (bool)((byte)(uVar24 >> 2) & 1);
            auVar68._8_4_ = (uint)bVar12 * auVar69._8_4_ | (uint)!bVar12 * auVar67._8_4_;
            bVar12 = (bool)((byte)(uVar24 >> 3) & 1);
            auVar68._12_4_ = (uint)bVar12 * auVar69._12_4_ | (uint)!bVar12 * auVar67._12_4_;
            bVar12 = (bool)((byte)(uVar24 >> 4) & 1);
            auVar68._16_4_ = (uint)bVar12 * auVar69._16_4_ | (uint)!bVar12 * auVar67._16_4_;
            bVar12 = (bool)((byte)(uVar24 >> 5) & 1);
            auVar68._20_4_ = (uint)bVar12 * auVar69._20_4_ | (uint)!bVar12 * auVar67._20_4_;
            bVar12 = (bool)((byte)(uVar24 >> 6) & 1);
            auVar68._24_4_ = (uint)bVar12 * auVar69._24_4_ | (uint)!bVar12 * auVar67._24_4_;
            bVar12 = (bool)((byte)(uVar24 >> 7) & 1);
            auVar68._28_4_ = (uint)bVar12 * auVar69._28_4_ | (uint)!bVar12 * auVar67._28_4_;
            auVar67 = vpermt2q_avx512vl(auVar65,auVar68,auVar66);
            sVar35 = auVar67._0_8_;
            iVar23 = 0;
            uVar24 = unaff_RBP - 1 & unaff_RBP;
            if (uVar24 != 0) {
              auVar67 = vpshufd_avx2(auVar68,0x55);
              vpermt2q_avx512vl(auVar65,auVar67,auVar66);
              auVar69 = vpminsd_avx2(auVar68,auVar67);
              auVar67 = vpmaxsd_avx2(auVar68,auVar67);
              uVar24 = uVar24 - 1 & uVar24;
              if (uVar24 == 0) {
                auVar62 = vpermi2q_avx512vl(auVar69,auVar65,auVar66);
                sVar35 = auVar62._0_8_;
                auVar62 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                (local_2648->ptr).ptr = auVar62._0_8_;
                auVar62 = vpermd_avx2(auVar67,auVar92);
                local_2648->dist = auVar62._0_4_;
                local_2648 = local_2648 + 1;
              }
              else {
                auVar15 = vpshufd_avx2(auVar68,0xaa);
                vpermt2q_avx512vl(auVar65,auVar15,auVar66);
                auVar71 = vpminsd_avx2(auVar69,auVar15);
                auVar69 = vpmaxsd_avx2(auVar69,auVar15);
                auVar15 = vpminsd_avx2(auVar67,auVar69);
                auVar67 = vpmaxsd_avx2(auVar67,auVar69);
                uVar24 = uVar24 - 1 & uVar24;
                if (uVar24 == 0) {
                  auVar62 = vpermi2q_avx512vl(auVar71,auVar65,auVar66);
                  sVar35 = auVar62._0_8_;
                  auVar62 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                  (local_2648->ptr).ptr = auVar62._0_8_;
                  auVar62 = vpermd_avx2(auVar67,auVar92);
                  local_2648->dist = auVar62._0_4_;
                  auVar62 = vpermt2q_avx512vl(auVar65,auVar15,auVar66);
                  local_2648[1].ptr.ptr = auVar62._0_8_;
                  auVar62 = vpermd_avx2(auVar15,auVar92);
                  local_2648[1].dist = auVar62._0_4_;
                  local_2648 = local_2648 + 2;
                }
                else {
                  auVar69 = vpshufd_avx2(auVar68,0xff);
                  vpermt2q_avx512vl(auVar65,auVar69,auVar66);
                  auVar14 = vpminsd_avx2(auVar71,auVar69);
                  auVar69 = vpmaxsd_avx2(auVar71,auVar69);
                  auVar71 = vpminsd_avx2(auVar15,auVar69);
                  auVar69 = vpmaxsd_avx2(auVar15,auVar69);
                  auVar15 = vpminsd_avx2(auVar67,auVar69);
                  auVar67 = vpmaxsd_avx2(auVar67,auVar69);
                  uVar24 = uVar24 - 1 & uVar24;
                  iVar23 = 0;
                  if (uVar24 == 0) {
                    auVar68 = vpermi2q_avx512vl(auVar14,auVar65,auVar66);
                    sVar35 = auVar68._0_8_;
                    auVar68 = vpermt2q_avx512vl(auVar65,auVar67,auVar66);
                    (local_2648->ptr).ptr = auVar68._0_8_;
                    in_ZMM13 = ZEXT3264(auVar92);
                    auVar67 = vpermd_avx2(auVar67,auVar92);
                    local_2648->dist = auVar67._0_4_;
                    auVar67 = vpermt2q_avx512vl(auVar65,auVar15,auVar66);
                    local_2648[1].ptr.ptr = auVar67._0_8_;
                    auVar67 = vpermd_avx2(auVar15,auVar92);
                    local_2648[1].dist = auVar67._0_4_;
                    auVar65 = vpermt2q_avx512vl(auVar65,auVar71,auVar66);
                    local_2648[2].ptr.ptr = auVar65._0_8_;
                    auVar65 = vpermd_avx2(auVar71,auVar92);
                    local_2648[2].dist = auVar65._0_4_;
                    local_2648 = local_2648 + 3;
                    auVar84 = ZEXT3264(auVar62);
                    auVar87 = ZEXT3264(auVar78);
                    auVar89 = ZEXT3264(auVar88);
                    auVar91 = ZEXT3264(auVar90);
                  }
                  else {
                    auVar70 = valignd_avx512vl(auVar68,auVar68,3);
                    auVar68 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                    auVar69 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                   CONCAT48(0x80000000,
                                                                            0x8000000080000000))),
                                                auVar68,auVar14);
                    auVar68 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                    auVar69 = vpermt2d_avx512vl(auVar69,auVar68,auVar71);
                    auVar69 = vpermt2d_avx512vl(auVar69,auVar68,auVar15);
                    auVar68 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar67 = vpermt2d_avx512vl(auVar69,auVar68,auVar67);
                    auVar84 = ZEXT3264(auVar67);
                    uVar29 = uVar24;
                    do {
                      auVar68 = auVar84._0_32_;
                      auVar67._8_4_ = 1;
                      auVar67._0_8_ = 0x100000001;
                      auVar67._12_4_ = 1;
                      auVar67._16_4_ = 1;
                      auVar67._20_4_ = 1;
                      auVar67._24_4_ = 1;
                      auVar67._28_4_ = 1;
                      auVar67 = vpermd_avx2(auVar67,auVar70);
                      auVar70 = valignd_avx512vl(auVar70,auVar70,1);
                      vpermt2q_avx512vl(auVar65,auVar70,auVar66);
                      uVar29 = uVar29 - 1 & uVar29;
                      uVar19 = vpcmpd_avx512vl(auVar67,auVar68,5);
                      auVar67 = vpmaxsd_avx2(auVar67,auVar68);
                      bVar26 = (byte)uVar19 << 1;
                      auVar68 = valignd_avx512vl(auVar68,auVar68,7);
                      bVar12 = (bool)((byte)uVar19 & 1);
                      auVar71._4_4_ = (uint)bVar12 * auVar68._4_4_ | (uint)!bVar12 * auVar67._4_4_;
                      auVar71._0_4_ = auVar67._0_4_;
                      bVar12 = (bool)(bVar26 >> 2 & 1);
                      auVar71._8_4_ = (uint)bVar12 * auVar68._8_4_ | (uint)!bVar12 * auVar67._8_4_;
                      bVar12 = (bool)(bVar26 >> 3 & 1);
                      auVar71._12_4_ =
                           (uint)bVar12 * auVar68._12_4_ | (uint)!bVar12 * auVar67._12_4_;
                      bVar12 = (bool)(bVar26 >> 4 & 1);
                      auVar71._16_4_ =
                           (uint)bVar12 * auVar68._16_4_ | (uint)!bVar12 * auVar67._16_4_;
                      bVar12 = (bool)(bVar26 >> 5 & 1);
                      auVar71._20_4_ =
                           (uint)bVar12 * auVar68._20_4_ | (uint)!bVar12 * auVar67._20_4_;
                      bVar12 = (bool)(bVar26 >> 6 & 1);
                      auVar71._24_4_ =
                           (uint)bVar12 * auVar68._24_4_ | (uint)!bVar12 * auVar67._24_4_;
                      auVar71._28_4_ =
                           (uint)(bVar26 >> 7) * auVar68._28_4_ |
                           (uint)!(bool)(bVar26 >> 7) * auVar67._28_4_;
                      auVar84 = ZEXT3264(auVar71);
                    } while (uVar29 != 0);
                    lVar28 = POPCOUNT(uVar24) + 3;
                    do {
                      auVar67 = vpermi2q_avx512vl(auVar71,auVar65,auVar66);
                      (local_2648->ptr).ptr = auVar67._0_8_;
                      auVar68 = auVar84._0_32_;
                      auVar67 = vpermd_avx2(auVar68,auVar92);
                      local_2648->dist = auVar67._0_4_;
                      auVar71 = valignd_avx512vl(auVar68,auVar68,1);
                      local_2648 = local_2648 + 1;
                      auVar84 = ZEXT3264(auVar71);
                      lVar28 = lVar28 + -1;
                    } while (lVar28 != 0);
                    auVar65 = vpermt2q_avx512vl(auVar65,auVar71,auVar66);
                    sVar35 = auVar65._0_8_;
                    auVar84 = ZEXT3264(auVar62);
                    auVar87 = ZEXT3264(auVar78);
                    auVar89 = ZEXT3264(auVar88);
                    auVar91 = ZEXT3264(auVar90);
                    in_ZMM13 = ZEXT3264(auVar92);
                  }
                }
              }
            }
          }
        }
        else {
          iVar23 = 6;
        }
      } while (iVar23 == 0);
    } while (iVar23 != 6);
    local_2638 = (ulong)((uint)sVar35 & 0xf) - 8;
    local_2650 = unaff_RBP;
    if (local_2638 != 0) {
      uVar36 = sVar35 & 0xfffffffffffffff0;
      lVar28 = 0;
      do {
        lVar25 = lVar28 * 0x50;
        pSVar6 = context->scene;
        pGVar7 = (pSVar6->geometries).items[*(uint *)(uVar36 + 0x30 + lVar25)].ptr;
        fVar80 = (pGVar7->time_range).lower;
        fVar80 = pGVar7->fnumTimeSegments *
                 ((*(float *)(ray + k * 4 + 0x70) - fVar80) / ((pGVar7->time_range).upper - fVar80))
        ;
        auVar43 = vroundss_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80),9);
        auVar43 = vminss_avx(auVar43,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
        auVar61 = vmaxss_avx(ZEXT816(0) << 0x20,auVar43);
        lVar39 = (long)(int)auVar61._0_4_ * 0x38;
        uVar41 = CONCAT44(0,*(uint *)(uVar36 + lVar25));
        local_2518._0_8_ = uVar41;
        lVar8 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar39);
        auVar43 = *(undefined1 (*) [16])(lVar8 + uVar41 * 4);
        uVar42 = (ulong)*(uint *)(uVar36 + 0x10 + lVar25);
        auVar44 = *(undefined1 (*) [16])(lVar8 + uVar42 * 4);
        uVar30 = (ulong)*(uint *)(uVar36 + 0x20 + lVar25);
        auVar2 = *(undefined1 (*) [16])(lVar8 + uVar30 * 4);
        uVar24 = (ulong)*(uint *)(uVar36 + 4 + lVar25);
        auVar45 = *(undefined1 (*) [16])(lVar8 + uVar24 * 4);
        uVar29 = (ulong)*(uint *)(uVar36 + 0x14 + lVar25);
        auVar56 = *(undefined1 (*) [16])(lVar8 + uVar29 * 4);
        uVar31 = (ulong)*(uint *)(uVar36 + 0x24 + lVar25);
        auVar60 = *(undefined1 (*) [16])(lVar8 + uVar31 * 4);
        uVar32 = (ulong)*(uint *)(uVar36 + 8 + lVar25);
        auVar46 = *(undefined1 (*) [16])(lVar8 + uVar32 * 4);
        uVar33 = (ulong)*(uint *)(uVar36 + 0x18 + lVar25);
        auVar48 = *(undefined1 (*) [16])(lVar8 + uVar33 * 4);
        uVar27 = (ulong)*(uint *)(uVar36 + 0x28 + lVar25);
        auVar58 = *(undefined1 (*) [16])(lVar8 + uVar27 * 4);
        uVar34 = (ulong)*(uint *)(uVar36 + 0xc + lVar25);
        auVar59 = *(undefined1 (*) [16])(lVar8 + uVar34 * 4);
        uVar37 = (ulong)*(uint *)(uVar36 + 0x1c + lVar25);
        auVar57 = *(undefined1 (*) [16])(lVar8 + uVar37 * 4);
        lVar39 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar39);
        uVar40 = (ulong)*(uint *)(uVar36 + 0x2c + lVar25);
        auVar47 = *(undefined1 (*) [16])(lVar8 + uVar40 * 4);
        auVar49 = *(undefined1 (*) [16])(lVar39 + uVar41 * 4);
        auVar50 = *(undefined1 (*) [16])(lVar39 + uVar42 * 4);
        auVar53 = *(undefined1 (*) [16])(lVar39 + uVar30 * 4);
        auVar51 = *(undefined1 (*) [16])(lVar39 + uVar24 * 4);
        auVar52 = *(undefined1 (*) [16])(lVar39 + uVar29 * 4);
        auVar54 = *(undefined1 (*) [16])(lVar39 + uVar31 * 4);
        auVar55 = *(undefined1 (*) [16])(lVar39 + uVar32 * 4);
        auVar74 = *(undefined1 (*) [16])(lVar39 + uVar33 * 4);
        auVar75 = *(undefined1 (*) [16])(lVar39 + uVar27 * 4);
        auVar3 = *(undefined1 (*) [16])(lVar39 + uVar34 * 4);
        auVar4 = *(undefined1 (*) [16])(lVar39 + uVar37 * 4);
        auVar5 = *(undefined1 (*) [16])(lVar39 + uVar40 * 4);
        puVar1 = (undefined8 *)(uVar36 + 0x30 + lVar25);
        local_24f8 = *puVar1;
        uStack_24f0 = puVar1[1];
        puVar1 = (undefined8 *)(uVar36 + 0x40 + lVar25);
        auVar76 = vunpcklps_avx(auVar43,auVar46);
        auVar43 = vunpckhps_avx(auVar43,auVar46);
        auVar46 = vunpcklps_avx(auVar45,auVar59);
        auVar45 = vunpckhps_avx(auVar45,auVar59);
        auVar59 = vunpcklps_avx(auVar43,auVar45);
        auVar13 = vunpcklps_avx(auVar76,auVar46);
        auVar43 = vunpckhps_avx(auVar76,auVar46);
        auVar46 = vunpcklps_avx(auVar44,auVar48);
        auVar44 = vunpckhps_avx(auVar44,auVar48);
        auVar48 = vunpcklps_avx(auVar56,auVar57);
        auVar45 = vunpckhps_avx(auVar56,auVar57);
        auVar56 = vunpcklps_avx(auVar44,auVar45);
        auVar57 = vunpcklps_avx(auVar46,auVar48);
        auVar44 = vunpckhps_avx(auVar46,auVar48);
        auVar46 = vunpcklps_avx(auVar2,auVar58);
        auVar2 = vunpckhps_avx(auVar2,auVar58);
        auVar48 = vunpcklps_avx(auVar60,auVar47);
        auVar45 = vunpckhps_avx(auVar60,auVar47);
        auVar60 = vunpcklps_avx(auVar2,auVar45);
        auVar58 = vunpcklps_avx(auVar46,auVar48);
        auVar2 = vunpckhps_avx(auVar46,auVar48);
        auVar45 = vunpcklps_avx512vl(auVar49,auVar55);
        auVar46 = vunpckhps_avx512vl(auVar49,auVar55);
        auVar47 = vunpcklps_avx512vl(auVar51,auVar3);
        auVar48 = vunpckhps_avx512vl(auVar51,auVar3);
        auVar46 = vunpcklps_avx(auVar46,auVar48);
        auVar48 = vunpcklps_avx(auVar45,auVar47);
        auVar45 = vunpckhps_avx(auVar45,auVar47);
        auVar47 = vunpcklps_avx512vl(auVar50,auVar74);
        auVar49 = vunpckhps_avx512vl(auVar50,auVar74);
        auVar50 = vunpcklps_avx512vl(auVar52,auVar4);
        auVar51 = vunpckhps_avx512vl(auVar52,auVar4);
        auVar49 = vunpcklps_avx512vl(auVar49,auVar51);
        auVar51 = vunpcklps_avx512vl(auVar47,auVar50);
        auVar50 = vunpckhps_avx512vl(auVar47,auVar50);
        auVar52 = vunpcklps_avx512vl(auVar53,auVar75);
        auVar47 = vunpckhps_avx512vl(auVar53,auVar75);
        auVar53 = vunpcklps_avx512vl(auVar54,auVar5);
        auVar54 = vunpckhps_avx512vl(auVar54,auVar5);
        auVar47 = vunpcklps_avx(auVar47,auVar54);
        auVar54 = vunpcklps_avx512vl(auVar52,auVar53);
        auVar53 = vunpckhps_avx512vl(auVar52,auVar53);
        auVar55 = ZEXT416((uint)(fVar80 - auVar61._0_4_));
        auVar52 = vbroadcastss_avx512vl(auVar55);
        auVar55 = vsubss_avx512f(ZEXT416(0x3f800000),auVar55);
        auVar74._0_4_ = auVar55._0_4_;
        auVar74._4_4_ = auVar74._0_4_;
        auVar74._8_4_ = auVar74._0_4_;
        auVar74._12_4_ = auVar74._0_4_;
        auVar48 = vmulps_avx512vl(auVar52,auVar48);
        auVar45 = vmulps_avx512vl(auVar52,auVar45);
        auVar55 = vmulps_avx512vl(auVar52,auVar46);
        auVar46 = vfmadd231ps_fma(auVar48,auVar74,auVar13);
        auVar48 = vfmadd231ps_fma(auVar45,auVar74,auVar43);
        auVar59 = vfmadd231ps_fma(auVar55,auVar74,auVar59);
        auVar43 = vmulps_avx512vl(auVar52,auVar51);
        auVar45 = vmulps_avx512vl(auVar52,auVar50);
        auVar49 = vmulps_avx512vl(auVar52,auVar49);
        auVar43 = vfmadd231ps_fma(auVar43,auVar74,auVar57);
        auVar44 = vfmadd231ps_fma(auVar45,auVar74,auVar44);
        auVar45 = vfmadd231ps_fma(auVar49,auVar74,auVar56);
        auVar56 = vmulps_avx512vl(auVar52,auVar54);
        auVar57 = vmulps_avx512vl(auVar52,auVar53);
        auVar47 = vmulps_avx512vl(auVar52,auVar47);
        auVar56 = vfmadd231ps_fma(auVar56,auVar74,auVar58);
        auVar58 = vfmadd231ps_fma(auVar57,auVar74,auVar2);
        auVar60 = vfmadd231ps_fma(auVar47,auVar74,auVar60);
        local_25f8 = *puVar1;
        uStack_25f0 = puVar1[1];
        auVar43 = vsubps_avx(auVar46,auVar43);
        auVar44 = vsubps_avx(auVar48,auVar44);
        auVar2 = vsubps_avx(auVar59,auVar45);
        auVar45 = vsubps_avx(auVar56,auVar46);
        auVar57 = vsubps_avx512vl(auVar58,auVar48);
        auVar56 = vsubps_avx(auVar60,auVar59);
        auVar47._0_4_ = auVar44._0_4_ * auVar56._0_4_;
        auVar47._4_4_ = auVar44._4_4_ * auVar56._4_4_;
        auVar47._8_4_ = auVar44._8_4_ * auVar56._8_4_;
        auVar47._12_4_ = auVar44._12_4_ * auVar56._12_4_;
        local_2568 = vfmsub231ps_avx512vl(auVar47,auVar57,auVar2);
        auVar49._0_4_ = auVar2._0_4_ * auVar45._0_4_;
        auVar49._4_4_ = auVar2._4_4_ * auVar45._4_4_;
        auVar49._8_4_ = auVar2._8_4_ * auVar45._8_4_;
        auVar49._12_4_ = auVar2._12_4_ * auVar45._12_4_;
        local_2558 = vfmsub231ps_fma(auVar49,auVar56,auVar43);
        auVar58 = vmulps_avx512vl(auVar43,auVar57);
        fVar80 = *(float *)(ray + k * 4 + 0x40);
        auVar53._4_4_ = fVar80;
        auVar53._0_4_ = fVar80;
        auVar53._8_4_ = fVar80;
        auVar53._12_4_ = fVar80;
        fVar81 = *(float *)(ray + k * 4 + 0x50);
        auVar51._4_4_ = fVar81;
        auVar51._0_4_ = fVar81;
        auVar51._8_4_ = fVar81;
        auVar51._12_4_ = fVar81;
        auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar72 = *(undefined4 *)(ray + k * 4);
        auVar60._4_4_ = uVar72;
        auVar60._0_4_ = uVar72;
        auVar60._8_4_ = uVar72;
        auVar60._12_4_ = uVar72;
        auVar49 = vsubps_avx512vl(auVar46,auVar60);
        local_2548 = vfmsub231ps_fma(auVar58,auVar45,auVar44);
        uVar72 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar46._4_4_ = uVar72;
        auVar46._0_4_ = uVar72;
        auVar46._8_4_ = uVar72;
        auVar46._12_4_ = uVar72;
        auVar50 = vsubps_avx512vl(auVar48,auVar46);
        uVar72 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar48._4_4_ = uVar72;
        auVar48._0_4_ = uVar72;
        auVar48._8_4_ = uVar72;
        auVar48._12_4_ = uVar72;
        auVar48 = vsubps_avx512vl(auVar59,auVar48);
        auVar59._0_4_ = fVar81 * auVar48._0_4_;
        auVar59._4_4_ = fVar81 * auVar48._4_4_;
        auVar59._8_4_ = fVar81 * auVar48._8_4_;
        auVar59._12_4_ = fVar81 * auVar48._12_4_;
        auVar59 = vfmsub231ps_avx512vl(auVar59,auVar50,auVar47);
        auVar60 = vmulps_avx512vl(auVar47,auVar49);
        auVar60 = vfmsub231ps_fma(auVar60,auVar48,auVar53);
        auVar55._0_4_ = fVar80 * auVar50._0_4_;
        auVar55._4_4_ = fVar80 * auVar50._4_4_;
        auVar55._8_4_ = fVar80 * auVar50._8_4_;
        auVar55._12_4_ = fVar80 * auVar50._12_4_;
        auVar46 = vfmsub231ps_fma(auVar55,auVar49,auVar51);
        auVar58 = vmulps_avx512vl(local_2548,auVar47);
        auVar58 = vfmadd231ps_avx512vl(auVar58,local_2558,auVar51);
        auVar47 = vfmadd231ps_avx512vl(auVar58,local_2568,auVar53);
        auVar58._8_4_ = 0x7fffffff;
        auVar58._0_8_ = 0x7fffffff7fffffff;
        auVar58._12_4_ = 0x7fffffff;
        local_25b8 = vandps_avx512vl(auVar47,auVar58);
        auVar52._8_4_ = 0x80000000;
        auVar52._0_8_ = 0x8000000080000000;
        auVar52._12_4_ = 0x80000000;
        auVar58 = vandps_avx512vl(auVar47,auVar52);
        auVar54._0_4_ = auVar56._0_4_ * auVar46._0_4_;
        auVar54._4_4_ = auVar56._4_4_ * auVar46._4_4_;
        auVar54._8_4_ = auVar56._8_4_ * auVar46._8_4_;
        auVar54._12_4_ = auVar56._12_4_ * auVar46._12_4_;
        auVar56 = vfmadd231ps_avx512vl(auVar54,auVar60,auVar57);
        auVar45 = vfmadd231ps_fma(auVar56,auVar59,auVar45);
        uVar73 = auVar58._0_4_;
        local_25e8._0_4_ = (float)(uVar73 ^ auVar45._0_4_);
        uVar79 = auVar58._4_4_;
        local_25e8._4_4_ = (float)(uVar79 ^ auVar45._4_4_);
        uVar85 = auVar58._8_4_;
        local_25e8._8_4_ = (float)(uVar85 ^ auVar45._8_4_);
        uVar86 = auVar58._12_4_;
        local_25e8._12_4_ = (float)(uVar86 ^ auVar45._12_4_);
        auVar45._0_4_ = auVar2._0_4_ * auVar46._0_4_;
        auVar45._4_4_ = auVar2._4_4_ * auVar46._4_4_;
        auVar45._8_4_ = auVar2._8_4_ * auVar46._8_4_;
        auVar45._12_4_ = auVar2._12_4_ * auVar46._12_4_;
        auVar44 = vfmadd231ps_fma(auVar45,auVar44,auVar60);
        auVar43 = vfmadd231ps_fma(auVar44,auVar43,auVar59);
        local_25d8._0_4_ = (float)(uVar73 ^ auVar43._0_4_);
        local_25d8._4_4_ = (float)(uVar79 ^ auVar43._4_4_);
        local_25d8._8_4_ = (float)(uVar85 ^ auVar43._8_4_);
        local_25d8._12_4_ = (float)(uVar86 ^ auVar43._12_4_);
        auVar43 = ZEXT816(0) << 0x20;
        uVar19 = vcmpps_avx512vl(local_25e8,auVar43,5);
        uVar16 = vcmpps_avx512vl(local_25d8,auVar43,5);
        uVar17 = vcmpps_avx512vl(auVar47,auVar43,4);
        auVar43._0_4_ = local_25d8._0_4_ + local_25e8._0_4_;
        auVar43._4_4_ = local_25d8._4_4_ + local_25e8._4_4_;
        auVar43._8_4_ = local_25d8._8_4_ + local_25e8._8_4_;
        auVar43._12_4_ = local_25d8._12_4_ + local_25e8._12_4_;
        uVar18 = vcmpps_avx512vl(auVar43,local_25b8,2);
        local_25a7 = (byte)uVar19 & (byte)uVar16 & (byte)uVar17 & (byte)uVar18;
        if (local_25a7 != 0) {
          auVar56._0_4_ = local_2548._0_4_ * auVar48._0_4_;
          auVar56._4_4_ = local_2548._4_4_ * auVar48._4_4_;
          auVar56._8_4_ = local_2548._8_4_ * auVar48._8_4_;
          auVar56._12_4_ = local_2548._12_4_ * auVar48._12_4_;
          auVar43 = vfmadd213ps_fma(auVar50,local_2558,auVar56);
          auVar43 = vfmadd213ps_fma(auVar49,local_2568,auVar43);
          local_25c8._0_4_ = (float)(uVar73 ^ auVar43._0_4_);
          local_25c8._4_4_ = (float)(uVar79 ^ auVar43._4_4_);
          local_25c8._8_4_ = (float)(uVar85 ^ auVar43._8_4_);
          local_25c8._12_4_ = (float)(uVar86 ^ auVar43._12_4_);
          uVar72 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar44._4_4_ = uVar72;
          auVar44._0_4_ = uVar72;
          auVar44._8_4_ = uVar72;
          auVar44._12_4_ = uVar72;
          auVar43 = vmulps_avx512vl(local_25b8,auVar44);
          uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar2._4_4_ = uVar72;
          auVar2._0_4_ = uVar72;
          auVar2._8_4_ = uVar72;
          auVar2._12_4_ = uVar72;
          auVar44 = vmulps_avx512vl(local_25b8,auVar2);
          uVar19 = vcmpps_avx512vl(local_25c8,auVar44,2);
          uVar16 = vcmpps_avx512vl(auVar43,local_25c8,1);
          local_25a7 = (byte)uVar19 & (byte)uVar16 & local_25a7;
          uVar41 = (ulong)local_25a7;
          if (local_25a7 != 0) {
            auVar43 = vrcp14ps_avx512vl(local_25b8);
            auVar57._8_4_ = 0x3f800000;
            auVar57._0_8_ = &DAT_3f8000003f800000;
            auVar57._12_4_ = 0x3f800000;
            auVar44 = vfnmadd213ps_avx512vl(local_25b8,auVar43,auVar57);
            auVar43 = vfmadd132ps_fma(auVar44,auVar43,auVar43);
            fVar80 = auVar43._0_4_;
            local_2578._0_4_ = fVar80 * local_25c8._0_4_;
            fVar81 = auVar43._4_4_;
            local_2578._4_4_ = fVar81 * local_25c8._4_4_;
            fVar82 = auVar43._8_4_;
            local_2578._8_4_ = fVar82 * local_25c8._8_4_;
            fVar83 = auVar43._12_4_;
            local_2578._12_4_ = fVar83 * local_25c8._12_4_;
            auVar77 = ZEXT1664(local_2578);
            local_2598[0] = fVar80 * local_25e8._0_4_;
            local_2598[1] = fVar81 * local_25e8._4_4_;
            local_2598[2] = fVar82 * local_25e8._8_4_;
            local_2598[3] = fVar83 * local_25e8._12_4_;
            local_2588[0] = fVar80 * local_25d8._0_4_;
            local_2588[1] = fVar81 * local_25d8._4_4_;
            local_2588[2] = fVar82 * local_25d8._8_4_;
            local_2588[3] = fVar83 * local_25d8._12_4_;
            auVar75._8_4_ = 0x7f800000;
            auVar75._0_8_ = 0x7f8000007f800000;
            auVar75._12_4_ = 0x7f800000;
            auVar43 = vblendmps_avx512vl(auVar75,local_2578);
            auVar50._0_4_ =
                 (uint)(local_25a7 & 1) * auVar43._0_4_ | (uint)!(bool)(local_25a7 & 1) * 0x7f800000
            ;
            bVar12 = (bool)(local_25a7 >> 1 & 1);
            auVar50._4_4_ = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(local_25a7 >> 2 & 1);
            auVar50._8_4_ = (uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(local_25a7 >> 3 & 1);
            auVar50._12_4_ = (uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * 0x7f800000;
            auVar43 = vshufps_avx(auVar50,auVar50,0xb1);
            auVar43 = vminps_avx(auVar43,auVar50);
            auVar44 = vshufpd_avx(auVar43,auVar43,1);
            auVar43 = vminps_avx(auVar44,auVar43);
            uVar19 = vcmpps_avx512vl(auVar50,auVar43,0);
            bVar26 = (byte)uVar19 & local_25a7;
            if (((byte)uVar19 & local_25a7) == 0) {
              bVar26 = local_25a7;
            }
            uVar27 = 0;
            for (uVar42 = (ulong)bVar26; local_2640 = pSVar6, local_2630 = lVar28, (uVar42 & 1) == 0
                ; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
              uVar27 = uVar27 + 1;
            }
            do {
              uVar73 = *(uint *)((long)&local_24f8 + uVar27 * 4);
              local_2680 = (pSVar6->geometries).items[uVar73].ptr;
              if ((local_2680->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar41 = (ulong)(byte)(~(byte)(1 << ((uint)uVar27 & 0x1f)) & (byte)uVar41);
                bVar12 = true;
              }
              else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                      (local_2680->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                bVar12 = false;
              }
              else {
                local_2538 = auVar77._0_16_;
                local_2518 = auVar93._0_32_;
                fVar80 = local_2598[uVar27];
                h.u.field_0.i[1] = (int)fVar80;
                h.u.field_0.i[0] = (int)fVar80;
                h.u.field_0.i[2] = (int)fVar80;
                h.u.field_0.i[3] = (int)fVar80;
                h.v.field_0.v[0] = local_2588[uVar27];
                h.geomID.field_0 =
                     (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpbroadcastd_avx512vl();
                uVar72 = *(undefined4 *)((long)&local_25f8 + uVar27 * 4);
                h.primID.field_0.i[1] = uVar72;
                h.primID.field_0.i[0] = uVar72;
                h.primID.field_0.i[2] = uVar72;
                h.primID.field_0.i[3] = uVar72;
                h.Ng.field_0._0_4_ = *(undefined4 *)(local_2568 + uVar27 * 4);
                uVar72 = *(undefined4 *)(local_2558 + uVar27 * 4);
                h.Ng.field_0._20_4_ = uVar72;
                h.Ng.field_0._16_4_ = uVar72;
                h.Ng.field_0._24_4_ = uVar72;
                h.Ng.field_0._28_4_ = uVar72;
                uVar72 = *(undefined4 *)(local_2548 + uVar27 * 4);
                h.Ng.field_0._36_4_ = uVar72;
                h.Ng.field_0._32_4_ = uVar72;
                h.Ng.field_0._40_4_ = uVar72;
                h.Ng.field_0._44_4_ = uVar72;
                h.Ng.field_0._4_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._8_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._12_4_ = h.Ng.field_0._0_4_;
                h.v.field_0.v[1] = h.v.field_0.v[0];
                h.v.field_0.v[2] = h.v.field_0.v[0];
                h.v.field_0.v[3] = h.v.field_0.v[0];
                vpcmpeqd_avx2(ZEXT1632((undefined1  [16])h.u.field_0),
                              ZEXT1632((undefined1  [16])h.u.field_0));
                h.instID[0].field_0.i[1] = context->user->instID[0];
                h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
                h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
                h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
                h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2578 + uVar27 * 4);
                local_2698 = local_2528._0_8_;
                uStack_2690 = local_2528._8_8_;
                args.valid = (int *)&local_2698;
                args.geometryUserPtr = local_2680->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)&h;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (local_2680->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_2680->intersectionFilterN)(&args);
                }
                auVar3._8_8_ = uStack_2690;
                auVar3._0_8_ = local_2698;
                uVar42 = vptestmd_avx512vl(auVar3,auVar3);
                if ((uVar42 & 0xf) == 0) {
LAB_0083fd28:
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar72;
                }
                else {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_2680->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var9)(&args);
                  }
                  auVar4._8_8_ = uStack_2690;
                  auVar4._0_8_ = local_2698;
                  uVar42 = vptestmd_avx512vl(auVar4,auVar4);
                  uVar42 = uVar42 & 0xf;
                  bVar26 = (byte)uVar42;
                  if (bVar26 == 0) goto LAB_0083fd28;
                  iVar23 = *(int *)(args.hit + 4);
                  iVar20 = *(int *)(args.hit + 8);
                  iVar21 = *(int *)(args.hit + 0xc);
                  bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
                  bVar11 = SUB81(uVar42 >> 3,0);
                  *(uint *)(args.ray + 0xc0) =
                       (uint)(bVar26 & 1) * *(int *)args.hit |
                       (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xc0);
                  *(uint *)(args.ray + 0xc4) =
                       (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(args.ray + 0xc4);
                  *(uint *)(args.ray + 200) =
                       (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 200);
                  *(uint *)(args.ray + 0xcc) =
                       (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xcc);
                  iVar23 = *(int *)(args.hit + 0x14);
                  iVar20 = *(int *)(args.hit + 0x18);
                  iVar21 = *(int *)(args.hit + 0x1c);
                  bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
                  bVar11 = SUB81(uVar42 >> 3,0);
                  *(uint *)(args.ray + 0xd0) =
                       (uint)(bVar26 & 1) * *(int *)(args.hit + 0x10) |
                       (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xd0);
                  *(uint *)(args.ray + 0xd4) =
                       (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(args.ray + 0xd4);
                  *(uint *)(args.ray + 0xd8) =
                       (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0xd8);
                  *(uint *)(args.ray + 0xdc) =
                       (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xdc);
                  iVar23 = *(int *)(args.hit + 0x24);
                  iVar20 = *(int *)(args.hit + 0x28);
                  iVar21 = *(int *)(args.hit + 0x2c);
                  bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
                  bVar11 = SUB81(uVar42 >> 3,0);
                  *(uint *)(args.ray + 0xe0) =
                       (uint)(bVar26 & 1) * *(int *)(args.hit + 0x20) |
                       (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xe0);
                  *(uint *)(args.ray + 0xe4) =
                       (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(args.ray + 0xe4);
                  *(uint *)(args.ray + 0xe8) =
                       (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0xe8);
                  *(uint *)(args.ray + 0xec) =
                       (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xec);
                  iVar23 = *(int *)(args.hit + 0x34);
                  iVar20 = *(int *)(args.hit + 0x38);
                  iVar21 = *(int *)(args.hit + 0x3c);
                  bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
                  bVar11 = SUB81(uVar42 >> 3,0);
                  *(uint *)(args.ray + 0xf0) =
                       (uint)(bVar26 & 1) * *(int *)(args.hit + 0x30) |
                       (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xf0);
                  *(uint *)(args.ray + 0xf4) =
                       (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(args.ray + 0xf4);
                  *(uint *)(args.ray + 0xf8) =
                       (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0xf8);
                  *(uint *)(args.ray + 0xfc) =
                       (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0xfc);
                  iVar23 = *(int *)(args.hit + 0x44);
                  iVar20 = *(int *)(args.hit + 0x48);
                  iVar21 = *(int *)(args.hit + 0x4c);
                  bVar12 = (bool)((byte)(uVar42 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar42 >> 2) & 1);
                  bVar11 = SUB81(uVar42 >> 3,0);
                  *(uint *)(args.ray + 0x100) =
                       (uint)(bVar26 & 1) * *(int *)(args.hit + 0x40) |
                       (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0x100);
                  *(uint *)(args.ray + 0x104) =
                       (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(args.ray + 0x104);
                  *(uint *)(args.ray + 0x108) =
                       (uint)bVar10 * iVar20 | (uint)!bVar10 * *(int *)(args.ray + 0x108);
                  *(uint *)(args.ray + 0x10c) =
                       (uint)bVar11 * iVar21 | (uint)!bVar11 * *(int *)(args.ray + 0x10c);
                  auVar43 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar43;
                  auVar43 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar43;
                  auVar43 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar43;
                  auVar43 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar43;
                }
                auVar77 = ZEXT1664(local_2538);
                uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar5._4_4_ = uVar72;
                auVar5._0_4_ = uVar72;
                auVar5._8_4_ = uVar72;
                auVar5._12_4_ = uVar72;
                uVar19 = vcmpps_avx512vl(local_2538,auVar5,2);
                uVar41 = (ulong)(byte)(~(byte)(1 << ((uint)uVar27 & 0x1f)) & (byte)uVar41 &
                                      (byte)uVar19);
                bVar12 = true;
                auVar93 = ZEXT3264(local_2518);
                auVar94 = ZEXT3264(auVar94._0_32_);
                auVar95 = ZEXT3264(auVar95._0_32_);
                auVar96 = ZEXT3264(auVar96._0_32_);
                auVar97 = ZEXT3264(auVar97._0_32_);
              }
              if (!bVar12) {
                fVar80 = local_2598[uVar27];
                fVar81 = local_2588[uVar27];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2578 + uVar27 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2568 + uVar27 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2558 + uVar27 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2548 + uVar27 * 4);
                *(float *)(ray + k * 4 + 0xf0) = fVar80;
                *(float *)(ray + k * 4 + 0x100) = fVar81;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_25f8 + uVar27 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar73;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              bVar26 = (byte)uVar41;
              if (bVar26 == 0) break;
              auVar76._8_4_ = 0x7f800000;
              auVar76._0_8_ = 0x7f8000007f800000;
              auVar76._12_4_ = 0x7f800000;
              auVar43 = vblendmps_avx512vl(auVar76,auVar77._0_16_);
              auVar61._0_4_ =
                   (uint)(bVar26 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar26 & 1) * 0x7f800000;
              bVar12 = (bool)((byte)(uVar41 >> 1) & 1);
              auVar61._4_4_ = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)((byte)(uVar41 >> 2) & 1);
              auVar61._8_4_ = (uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)((byte)(uVar41 >> 3) & 1);
              auVar61._12_4_ = (uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * 0x7f800000;
              auVar43 = vshufps_avx(auVar61,auVar61,0xb1);
              auVar43 = vminps_avx(auVar43,auVar61);
              auVar44 = vshufpd_avx(auVar43,auVar43,1);
              auVar43 = vminps_avx(auVar44,auVar43);
              uVar19 = vcmpps_avx512vl(auVar61,auVar43,0);
              bVar26 = (byte)uVar19 & bVar26;
              uVar73 = (uint)uVar41;
              if (bVar26 != 0) {
                uVar73 = (uint)bVar26;
              }
              uVar79 = 0;
              for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                uVar79 = uVar79 + 1;
              }
              uVar27 = (ulong)uVar79;
            } while( true );
          }
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != local_2638);
    }
    uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar77 = ZEXT3264(CONCAT428(uVar72,CONCAT424(uVar72,CONCAT420(uVar72,CONCAT416(uVar72,CONCAT412
                                                  (uVar72,CONCAT48(uVar72,CONCAT44(uVar72,uVar72))))
                                                  ))));
    auVar84 = ZEXT3264(auVar63);
    auVar87 = ZEXT3264(auVar64);
    auVar62 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar89 = ZEXT3264(auVar62);
    auVar91 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    in_ZMM13 = ZEXT3264(in_ZMM13._0_32_);
    uVar36 = local_2670;
    unaff_RBP = local_2650;
    uVar41 = local_2658;
    uVar27 = local_2660;
    uVar42 = local_2668;
    uVar30 = local_2678;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }